

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O1

void zzAddWMod(word *b,word *a,word w,word *mod,size_t n)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (n == 0) {
    uVar2 = 1;
  }
  else {
    uVar2 = 1;
    sVar1 = 0;
    do {
      uVar3 = w + a[sVar1];
      w = (word)CARRY8(w,a[sVar1]);
      b[sVar1] = uVar3;
      uVar4 = 0;
      if (mod[sVar1] == uVar3) {
        uVar4 = uVar2;
      }
      uVar2 = mod[sVar1] < uVar3 | uVar4;
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
  }
  zzSubAndW(b,mod,n,-(w | uVar2));
  return;
}

Assistant:

void SAFE(zzAddWMod)(word b[], const word a[], register word w, 
	const word mod[], size_t n)
{
	register word mask = 1;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	ASSERT(wwIsDisjoint(b, mod, n));
	ASSERT(wwCmp(a, mod, n) < 0 && wwCmpW(mod, n, w) > 0);
	// add
	for (i = 0; i < n; ++i)
	{
		b[i] = a[i] + w;
		w = wordLess01(b[i], w);
		// mask <-  mod[i] < b[i] | mask & mod[i] == b[i];
		mask &= wordEq01(mod[i], b[i]);
		mask |= wordLess01(mod[i], b[i]);
	}
	// sub
	mask |= w;
	mask = WORD_0 - mask;
	zzSubAndW(b, mod, n, mask);
	mask = w = 0;
}